

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O1

void __thiscall
bk_lib::pod_vector<long,_std::allocator<long>_>::resize
          (pod_vector<long,_std::allocator<long>_> *this,size_type ns,long *val)

{
  uint uVar1;
  long *first;
  
  uVar1 = (this->ebo_).size;
  if (uVar1 < ns) {
    if ((this->ebo_).cap < ns) {
      append_realloc(this,ns - uVar1,val);
    }
    else {
      first = (this->ebo_).buf + uVar1;
      detail::fill<long>(first,first + (ns - uVar1),val);
    }
  }
  (this->ebo_).size = ns;
  return;
}

Assistant:

void resize(size_type ns, const T& val = T()) {
		if (ns > size()) {
			ns <= capacity() ? detail::fill(end(), end()+(ns-size()), val) : append_realloc(ns-size(), val);
		}
		ebo_.size = ns;
	}